

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

void __thiscall cmCTestRunTest::CheckOutput(cmCTestRunTest *this,string *line)

{
  string *psVar1;
  cmCTest *pcVar2;
  char *pcVar3;
  cmCTestTestProperties *pcVar4;
  pointer pbVar5;
  pointer pbVar6;
  bool bVar7;
  ostream *poVar8;
  long lVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  ulong uVar11;
  RegularExpression *pRVar12;
  iterator __begin2;
  pointer this_00;
  string label;
  ostringstream cmCTestLog_msg;
  value_type local_1f0;
  pointer local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  poVar8 = (ostream *)std::ostream::operator<<((ostringstream *)&local_1a8,this->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(line->_M_dataplus)._M_p,line->_M_string_length);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2c,local_1f0._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((line->_M_string_length != 0) &&
     (lVar9 = std::__cxx11::string::find((char *)line,0x89f660,0), lVar9 != -1)) {
    pRVar12 = &this->TestHandler->CustomCompletionStatusRegex;
    bVar7 = cmsys::RegularExpression::find(pRVar12,(line->_M_dataplus)._M_p,&pRVar12->regmatch);
    if (bVar7) {
      pcVar3 = (this->TestHandler->CustomCompletionStatusRegex).regmatch.startp[1];
      if (pcVar3 == (char *)0x0) {
        local_1a8 = &local_198;
        local_1a0 = 0;
        local_198 = 0;
      }
      else {
        local_1a8 = &local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a8,pcVar3,
                   (this->TestHandler->CustomCompletionStatusRegex).regmatch.endp[1]);
      }
      std::__cxx11::string::operator=
                ((string *)&(this->TestResult).CustomCompletionStatus,(string *)&local_1a8);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar8 = (ostream *)std::ostream::operator<<((ostringstream *)&local_1a8,this->Index);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Test Details changed to \'",0x19);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(this->TestResult).CustomCompletionStatus._M_dataplus._M_p,
                          (this->TestResult).CustomCompletionStatus._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x3a,local_1f0._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                 local_1f0.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      return;
    }
    pRVar12 = &this->TestHandler->CustomLabelRegex;
    bVar7 = cmsys::RegularExpression::find(pRVar12,(line->_M_dataplus)._M_p,&pRVar12->regmatch);
    if (bVar7) {
      pcVar3 = (this->TestHandler->CustomLabelRegex).regmatch.startp[1];
      if (pcVar3 == (char *)0x0) {
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        local_1f0._M_string_length = 0;
        local_1f0.field_2._M_local_buf[0] = '\0';
      }
      else {
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,pcVar3,
                   (this->TestHandler->CustomLabelRegex).regmatch.endp[1]);
      }
      pcVar4 = this->TestProperties;
      _Var10 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((pcVar4->Labels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (pcVar4->Labels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&local_1f0);
      if (_Var10._M_current ==
          (pcVar4->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pcVar4->Labels,&local_1f0);
        pbVar5 = (pcVar4->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = (pcVar4->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar5 != pbVar6) {
          uVar11 = (long)pbVar6 - (long)pbVar5 >> 5;
          lVar9 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar9 == 0; lVar9 = lVar9 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (pbVar5,pbVar6,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pbVar5,pbVar6);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        poVar8 = (ostream *)std::ostream::operator<<(&local_1a8,this->Index);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Test Label added: \'",0x13);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x45,(char *)local_1c8,false);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p == &local_1f0.field_2) {
        return;
      }
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                               local_1f0.field_2._M_local_buf[0]) + 1);
      return;
    }
  }
  psVar1 = &this->ProcessOutput;
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)(line->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)psVar1);
  this_00 = (this->TestProperties->TimeoutRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1d0 = (this->TestProperties->TimeoutRegularExpressions).
              super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != local_1d0) {
    do {
      while (bVar7 = cmsys::RegularExpression::find
                               (&this_00->first,(psVar1->_M_dataplus)._M_p,
                                (RegularExpressionMatch *)this_00), bVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        poVar8 = (ostream *)std::ostream::operator<<((ostringstream *)&local_1a8,this->Index);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Test timeout changed to ",0x18);
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x5b,local_1f0._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,
                          CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                   local_1f0.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        cmProcess::ResetStartTime
                  ((this->TestProcess)._M_t.
                   super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
                   super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                   super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl);
        cmProcess::ChangeTimeout
                  ((this->TestProcess)._M_t.
                   super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
                   super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
                   super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl,
                   (cmDuration)(this->TestProperties->AlternateTimeout).__r);
        std::
        vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_erase_at_end(&this->TestProperties->TimeoutRegularExpressions,
                          (this->TestProperties->TimeoutRegularExpressions).
                          super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        this_00 = this_00 + 1;
        if (bVar7 || this_00 == local_1d0) {
          return;
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 != local_1d0);
  }
  return;
}

Assistant:

void cmCTestRunTest::CheckOutput(std::string const& line)
{
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             this->GetIndex() << ": " << line << std::endl);

  // Check for special CTest XML tags in this line of output.
  // If any are found, this line is excluded from ProcessOutput.
  if (!line.empty() && line.find("<CTest") != std::string::npos) {
    bool ctest_tag_found = false;
    if (this->TestHandler->CustomCompletionStatusRegex.find(line)) {
      ctest_tag_found = true;
      this->TestResult.CustomCompletionStatus =
        this->TestHandler->CustomCompletionStatusRegex.match(1);
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 this->GetIndex() << ": "
                                  << "Test Details changed to '"
                                  << this->TestResult.CustomCompletionStatus
                                  << "'" << std::endl);
    } else if (this->TestHandler->CustomLabelRegex.find(line)) {
      ctest_tag_found = true;
      auto label = this->TestHandler->CustomLabelRegex.match(1);
      auto& labels = this->TestProperties->Labels;
      if (std::find(labels.begin(), labels.end(), label) == labels.end()) {
        labels.push_back(label);
        std::sort(labels.begin(), labels.end());
        cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                   this->GetIndex()
                     << ": "
                     << "Test Label added: '" << label << "'" << std::endl);
      }
    }
    if (ctest_tag_found) {
      return;
    }
  }

  this->ProcessOutput += line;
  this->ProcessOutput += "\n";

  // Check for TIMEOUT_AFTER_MATCH property.
  if (!this->TestProperties->TimeoutRegularExpressions.empty()) {
    for (auto& reg : this->TestProperties->TimeoutRegularExpressions) {
      if (reg.first.find(this->ProcessOutput)) {
        cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                   this->GetIndex()
                     << ": "
                     << "Test timeout changed to "
                     << std::chrono::duration_cast<std::chrono::seconds>(
                          this->TestProperties->AlternateTimeout)
                          .count()
                     << std::endl);
        this->TestProcess->ResetStartTime();
        this->TestProcess->ChangeTimeout(
          this->TestProperties->AlternateTimeout);
        this->TestProperties->TimeoutRegularExpressions.clear();
        break;
      }
    }
  }
}